

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reactor.cpp
# Opt level: O3

int main(void)

{
  int __fd;
  int __fd_00;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  ssize_t sVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  ostream *poVar9;
  char c;
  event evs [3];
  native_type fds [2];
  error_code e;
  reactor r;
  undefined1 local_79;
  int local_78;
  int iStack_74;
  int local_70;
  int iStack_6c;
  undefined1 local_68 [24];
  int local_50;
  int local_4c;
  int local_48;
  undefined8 local_40;
  event local_38;
  
  iVar7 = 0;
  poVar9 = (ostream *)&std::cerr;
  do {
    booster::aio::reactor::reactor((reactor *)&local_38,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    booster::aio::reactor::name_abi_cxx11_();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT44(iStack_74,local_78),CONCAT44(iStack_6c,local_70));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((undefined1 *)CONCAT44(iStack_74,local_78) != local_68) {
      operator_delete((undefined1 *)CONCAT44(iStack_74,local_78));
    }
    local_48 = 0;
    local_40 = std::_V2::system_category();
    iVar2 = (int)&local_38;
    booster::aio::reactor::select(iVar2,-1,(error_code *)0x1);
    if (local_48 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"e",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x19);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    pair(&local_50);
    __fd_00 = local_4c;
    __fd = local_50;
    booster::aio::reactor::select(iVar2,local_50);
    booster::aio::reactor::select(iVar2,__fd_00);
    iVar1 = booster::aio::reactor::poll(&local_38,(int)&local_78,3);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"r.poll(evs,3,0)==0",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x22);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    booster::aio::reactor::select(iVar2,__fd);
    booster::aio::reactor::select(iVar2,__fd_00);
    iVar1 = booster::aio::reactor::poll(&local_38,(int)&local_78,3);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"r.poll(evs,3,0)==2",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x25);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if ((local_70 != __fd_00 || local_78 != __fd) && (local_70 != __fd || local_78 != __fd_00)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "(evs[0].fd==a && evs[1].fd==b) || (evs[0].fd==b && evs[1].fd==a)",0x40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x27);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (iStack_74 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"evs[0].events==reactor::out",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x28);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (iStack_6c != 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"evs[1].events==reactor::out",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x29);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    booster::aio::reactor::select(iVar2,__fd);
    iVar1 = booster::aio::reactor::poll(&local_38,(int)&local_78,3);
    if (iVar1 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"r.poll(evs,3,0)==1",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x2b);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (local_78 != __fd_00) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"evs[0].fd==b",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x2c);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (iStack_74 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"evs[0].events==reactor::out",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x2d);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    local_79 = 0x78;
    send(__fd,&local_79,1,0);
    booster::aio::reactor::select(iVar2,__fd_00);
    iVar1 = booster::aio::reactor::poll(&local_38,(int)&local_78,3);
    if (iVar1 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"r.poll(evs,3,1000)==1",0x15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (local_78 != __fd_00) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"evs[0].fd==b",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x33);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (iStack_74 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"evs[0].events==reactor::in",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x34);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    booster::aio::reactor::select(iVar2,__fd_00);
    iVar2 = booster::aio::reactor::poll(&local_38,(int)&local_78,3);
    if (iVar2 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"r.poll(evs,3,0)==1",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x36);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (local_78 != __fd_00) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"evs[0].fd==b",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x37);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (iStack_74 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"evs[0].events==(reactor::out | reactor::in)",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x38);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    recv(__fd_00,&local_79,1,0);
    iVar2 = booster::aio::reactor::poll(&local_38,(int)&local_78,3);
    if (iVar2 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"r.poll(evs,3,0)==1",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x3a);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (local_78 != __fd_00) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"evs[0].fd==b",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x3b);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (iStack_74 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"evs[0].events==reactor::out",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x3c);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    shutdown(__fd,2);
    close(__fd);
    booster::ptime::millisleep(100);
    iVar2 = booster::aio::reactor::poll(&local_38,(int)&local_78,3);
    if (iVar2 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"r.poll(evs,3,0)==1",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x44);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (local_78 != __fd_00) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"evs[0].fd==b",0xc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x45);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    if (iStack_74 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"evs[0].events==(reactor::out | reactor::in)",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x46);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    sVar5 = recv(__fd_00,&local_79,1,0);
    if ((int)sVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"(res=recv(b,&c,1,0))==0",0x17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x48);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return_code = 1;
    }
    close(__fd_00);
    booster::aio::reactor::~reactor((reactor *)&local_38);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 6);
  if (return_code == 0) {
    pcVar8 = "Ok";
    lVar6 = 2;
    poVar9 = (ostream *)&std::cout;
  }
  else {
    pcVar8 = "Fail ";
    lVar6 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,lVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return return_code;
}

Assistant:

int main()
{
	try {
		for(int type=reactor::use_default;type<=reactor::use_max;type++) {
			reactor r(type);

			std::cout << "Testing " << type << ": " << r.name() << std::endl;

			booster::system::error_code e;
			r.select(booster::aio::invalid_socket,booster::aio::reactor::in,e);
			TEST(e);

			native_type fds[2];
			pair(fds);
			native_type a=fds[0];
			native_type b=fds[1];
			r.select(a,reactor::in);
			r.select(b,reactor::in);
			reactor::event evs[3];
			TEST(r.poll(evs,3,0)==0);
			r.select(a,reactor::in | reactor::out);
			r.select(b,reactor::in | reactor::out);
			TEST(r.poll(evs,3,0)==2);

			TEST((evs[0].fd==a && evs[1].fd==b) || (evs[0].fd==b && evs[1].fd==a));
			TEST(evs[0].events==reactor::out);
			TEST(evs[1].events==reactor::out);
			r.remove(a);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::out);
			char c='x';
			send(a,&c,1,0);

			r.select(b,reactor::in);
			TEST(r.poll(evs,3,1000)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::in);
			r.select(b,reactor::in | reactor::out);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==(reactor::out | reactor::in));
			recv(b,&c,1,0);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==reactor::out);
			#ifdef SHUT_RDWR
			shutdown(a,SHUT_RDWR);
			#else
			shutdown(a,SD_BOTH);
			#endif
			closefd(a);
			booster::ptime::millisleep(100);
			TEST(r.poll(evs,3,0)==1);
			TEST(evs[0].fd==b);
			TEST(evs[0].events==(reactor::out | reactor::in));
			int res;
			TEST((res=recv(b,&c,1,0))==0);
			closefd(b);
		}
	}
	catch(std::exception const &e) {
		std::cerr << "Error: "<< e.what() << std::endl;
		return 1;
	}
	if(return_code == 0)
		std::cout << "Ok" <<std::endl;
	else
		std::cerr << "Fail " << std::endl;
	return return_code;
}